

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderprogram.cpp
# Opt level: O2

int __thiscall graphics101::ShaderProgram::link(ShaderProgram *this,char *__from,char *__to)

{
  uint uVar1;
  pointer puVar2;
  ostream *poVar3;
  uint *shader;
  pointer puVar4;
  bool bVar5;
  GLint info_log_length;
  GLint status;
  vector<char,_std::allocator<char>_> info_log;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attached_shaders;
  
  (*gl3wProcs.ptr[0x14e])((ulong)this->m_program);
  status = 0;
  (*gl3wProcs.ptr[0xf2])((ulong)this->m_program,0x8b82,&status);
  if (status != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Shader linker error: ");
    poVar3 = std::operator<<(poVar3,'\n');
    uVar1 = this->m_program;
    info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    info_log_length = 0;
    (*gl3wProcs.ptr[0xf2])((ulong)uVar1,0x8b84);
    std::vector<char,_std::allocator<char>_>::resize(&info_log,(long)info_log_length);
    (*gl3wProcs.ptr[0xe8])
              ((ulong)uVar1,
               (ulong)(uint)((int)info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (int)info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start),0);
    std::__cxx11::string::string
              ((string *)&attached_shaders,
               info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,(allocator *)&info_log_length);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&info_log.super__Vector_base<char,_std::allocator<char>_>);
    poVar3 = std::operator<<(poVar3,(string *)&attached_shaders);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&attached_shaders);
  }
  attached_shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  attached_shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  attached_shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffff00000000);
  (*gl3wProcs.ptr[0xf2])((ulong)this->m_program,0x8b85);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&attached_shaders,
             (long)(int)info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  (*gl3wProcs.ptr[0xc0])
            ((ulong)this->m_program,
             (ulong)((long)attached_shaders.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)attached_shaders.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2,0);
  puVar2 = attached_shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar4 = attached_shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    (*gl3wProcs.ptr[0x7c])((ulong)this->m_program,(ulong)*puVar4);
  }
  bVar5 = status != 0;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&attached_shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return (int)CONCAT71((int7)((ulong)this >> 8),bVar5);
}

Assistant:

bool ShaderProgram::link() {
    glLinkProgram( m_program );
    
    GLint status = 0;
    glGetProgramiv( m_program, GL_LINK_STATUS, &status );
    
    if( status != GL_TRUE ) {
        cerr << "Shader linker error: " << '\n' << getProgramInfoLog(m_program) << '\n';
    }
    
    // Now that we have linked, detach all shaders.
    std::vector< GLuint > attached_shaders;
    {
        GLint num_attached_shaders = 0;
        glGetProgramiv( m_program, GL_ATTACHED_SHADERS, &num_attached_shaders );
        attached_shaders.resize( num_attached_shaders );
    }
    glGetAttachedShaders( m_program, attached_shaders.size(), nullptr, attached_shaders.data() );
    
	// Free the shaders by detaching them. (They have already been marked for deletion.)
	for( const auto& shader : attached_shaders ) {
	    glDetachShader( m_program, shader );
	}

    return status;
}